

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

Real amrex::MultiFab::Dot
               (MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,bool local)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  MFIter mfi;
  Real local_1b0;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)x,true);
  local_1b0 = 0.0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_1b0 = 0.0;
    do {
      MFIter::growntilebox(&local_12c,&local_90,nghost);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&x->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&y->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < numcomp) {
        lVar10 = (long)local_12c.smallend.vect[2];
        lVar9 = (long)local_12c.smallend.vect[1];
        lVar3 = (long)ycomp * 8 * local_110.nstride +
                (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar10 - local_110.begin.z) * local_110.kstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                (long)local_110.p;
        lVar6 = (long)xcomp * 8 * local_d0.nstride +
                (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
                (lVar10 - local_d0.begin.z) * local_d0.kstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 +
                (long)local_d0.p;
        uVar2 = 0;
        do {
          lVar1 = lVar3;
          lVar7 = lVar10;
          lVar12 = lVar6;
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              lVar5 = lVar1;
              lVar8 = lVar9;
              lVar11 = lVar12;
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar4 = 0;
                    do {
                      local_1b0 = local_1b0 +
                                  *(double *)(lVar11 + lVar4 * 8) * *(double *)(lVar5 + lVar4 * 8);
                      lVar4 = lVar4 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar4);
                  }
                  lVar8 = lVar8 + 1;
                  lVar5 = lVar5 + local_110.jstride * 8;
                  lVar11 = lVar11 + local_d0.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar8);
              }
              lVar7 = lVar7 + 1;
              lVar1 = lVar1 + local_110.kstride * 8;
              lVar12 = lVar12 + local_d0.kstride * 8;
            } while (local_12c.bigend.vect[2] + 1 != (int)lVar7);
          }
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + local_110.nstride * 8;
          lVar6 = lVar6 + local_d0.nstride * 8;
        } while (uVar2 != (uint)numcomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return local_1b0;
}

Assistant:

Real
MultiFab::Dot (const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);

    BL_PROFILE("MultiFab::Dot()");

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            auto const& xfab = xma[box_no];
            auto const& yfab = yma[box_no];
            for (int n = 0; n < numcomp; ++n) {
                t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}